

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

void __thiscall HEkkPrimal::computePrimalSteepestEdgeWeights(HEkkPrimal *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  HEkk *pHVar5;
  pointer pdVar6;
  pointer piVar7;
  pointer pdVar8;
  bool bVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  HVector local_col_aq;
  HVectorBase<double> local_d0;
  
  std::vector<double,_std::allocator<double>_>::resize(&this->edge_weight_,(long)this->num_tot);
  bVar9 = HEkk::logicalBasis(this->ekk_instance_);
  if (bVar9) {
    iVar2 = this->num_col;
    if (0 < (long)iVar2) {
      pHVar5 = this->ekk_instance_;
      pdVar6 = (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (pHVar5->lp_).a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      do {
        pdVar6[lVar10] = 1.0;
        iVar3 = piVar7[lVar10];
        lVar11 = (long)iVar3;
        iVar4 = piVar7[lVar10 + 1];
        if (iVar3 < iVar4) {
          pdVar8 = (pHVar5->lp_).a_matrix_.value_.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar12 = pdVar6[lVar10];
          do {
            dVar1 = pdVar8[lVar11];
            dVar12 = dVar12 + dVar1 * dVar1;
            pdVar6[lVar10] = dVar12;
            lVar11 = lVar11 + 1;
          } while (iVar4 != lVar11);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != iVar2);
    }
  }
  else {
    local_d0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_d0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_d0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_d0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_d0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_d0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_d0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_d0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_d0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_d0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_d0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_d0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    local_d0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    HVectorBase<double>::setup(&local_d0,this->num_row);
    if (0 < this->num_tot) {
      lVar10 = 0;
      do {
        if ((this->ekk_instance_->basis_).nonbasicFlag_.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10] != '\0') {
          dVar12 = computePrimalSteepestEdgeWeight(this,(HighsInt)lVar10,&local_d0);
          (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10] = dVar12;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < this->num_tot);
    }
    if (local_d0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    if (local_d0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_d0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_d0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_d0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_d0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HEkkPrimal::computePrimalSteepestEdgeWeights() {
  const HighsInt report_var = -16;
  edge_weight_.resize(num_tot);
  if (ekk_instance_.logicalBasis()) {
    HighsSparseMatrix& a_matrix = ekk_instance_.lp_.a_matrix_;
    for (HighsInt iCol = 0; iCol < num_col; iCol++) {
      edge_weight_[iCol] = 1;
      for (HighsInt iEl = a_matrix.start_[iCol];
           iEl < a_matrix.start_[iCol + 1]; iEl++)
        edge_weight_[iCol] += a_matrix.value_[iEl] * a_matrix.value_[iEl];
    }
  } else {
    HVector local_col_aq;
    local_col_aq.setup(num_row);
    for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
      if (ekk_instance_.basis_.nonbasicFlag_[iVar]) {
        edge_weight_[iVar] =
            computePrimalSteepestEdgeWeight(iVar, local_col_aq);
        if (iVar == report_var) {
          printf("Tableau column %d\nRow       Value\n", (int)report_var);
          for (HighsInt iRow = 0; iRow < num_row; iRow++) {
            if (local_col_aq.array[iRow])
              printf("%3d  %10.7g\n", (int)iRow, local_col_aq.array[iRow]);
          }
        }
      }
    }
  }
}